

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  int iVar4;
  kj *this_00;
  Bar **params;
  Bar **params_00;
  long lVar5;
  undefined1 auVar6 [16];
  Bar bar;
  Fault f;
  String *in_stack_ffffffffffffff78;
  undefined **ppuVar7;
  String local_78;
  String local_60;
  String local_48;
  
  ppuVar7 = &PTR__Foo_001b7590;
  auVar6 = __dynamic_cast((kj *)&stack0xffffffffffffff80,&(anonymous_namespace)::Foo::typeinfo,
                          &(anonymous_namespace)::Bar::typeinfo);
  this_00 = auVar6._0_8_;
  if (this_00 == (kj *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,0x14d,FAILED,(char *)0x0,"\"Dynamic downcast returned null.\"",
               (char (*) [32])"Dynamic downcast returned null.");
    _::Debug::Fault::fatal((Fault *)&local_78);
  }
  if (_::Debug::minSeverity < 3 && (kj *)&stack0xffffffffffffff80 != this_00) {
    str<char_const(&)[31]>(&local_78,(kj *)"failed: expected (&bar) == (m)",auVar6._8_8_);
    str<kj::(anonymous_namespace)::Bar*&>(&local_60,(kj *)&stack0xffffffffffffff80,params);
    str<kj::(anonymous_namespace)::Bar*&>(&local_48,this_00,params_00);
    argValues.size_ = (size_t)ppuVar7;
    argValues.ptr = in_stack_ffffffffffffff78;
    _::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,(char *)0x14b,2,0x182151,(char *)&local_78,argValues);
    lVar5 = 0x30;
    do {
      lVar1 = *(long *)((long)&local_78.content.ptr + lVar5);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar5);
        *(undefined8 *)((long)&local_78.content.ptr + lVar5) = 0;
        *(undefined8 *)((long)&local_78.content.size_ + lVar5) = 0;
        puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar5);
        (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
      }
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  iVar4 = _::Debug::minSeverity;
  lVar5 = __dynamic_cast(&stack0xffffffffffffff80,&(anonymous_namespace)::Foo::typeinfo,
                         &(anonymous_namespace)::Baz::typeinfo,0);
  if ((lVar5 != 0) && (iVar4 < 3)) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,0x14f,ERROR,
               "\"failed: expected \" \"dynamicDowncastIfAvailable<Baz>(foo) == nullptr\"",
               (char (*) [65])"failed: expected dynamicDowncastIfAvailable<Baz>(foo) == nullptr");
  }
  return;
}

Assistant:

virtual ~Bar() {}